

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# distortion.cc
# Opt level: O2

void __thiscall
gmath::EquidistantDistortion::EquidistantDistortion
          (EquidistantDistortion *this,Properties *prop,int id)

{
  int in_ECX;
  int iVar1;
  undefined4 in_register_00000014;
  string local_38;
  
  (this->super_Distortion)._vptr_Distortion = (_func_int **)&PTR__Distortion_001249d0;
  (anonymous_namespace)::getCameraKey_abi_cxx11_
            (&local_38,(_anonymous_namespace_ *)"e1",(char *)CONCAT44(in_register_00000014,id),
             in_ECX);
  iVar1 = 0x11e133;
  gutil::Properties::getValue<double>(prop,local_38._M_dataplus._M_p,this->ed,"0");
  std::__cxx11::string::~string((string *)&local_38);
  (anonymous_namespace)::getCameraKey_abi_cxx11_
            (&local_38,(_anonymous_namespace_ *)"e2",(char *)(ulong)(uint)id,iVar1);
  iVar1 = 0x11e133;
  gutil::Properties::getValue<double>(prop,local_38._M_dataplus._M_p,this->ed + 1,"0");
  std::__cxx11::string::~string((string *)&local_38);
  (anonymous_namespace)::getCameraKey_abi_cxx11_
            (&local_38,(_anonymous_namespace_ *)"e3",(char *)(ulong)(uint)id,iVar1);
  iVar1 = 0x11e133;
  gutil::Properties::getValue<double>(prop,local_38._M_dataplus._M_p,this->ed + 2,"0");
  std::__cxx11::string::~string((string *)&local_38);
  (anonymous_namespace)::getCameraKey_abi_cxx11_
            (&local_38,(_anonymous_namespace_ *)"e4",(char *)(ulong)(uint)id,iVar1);
  gutil::Properties::getValue<double>(prop,local_38._M_dataplus._M_p,this->ed + 3,"0");
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

EquidistantDistortion::EquidistantDistortion(const gutil::Properties &prop, int id)
{
  prop.getValue(getCameraKey("e1", id).c_str(), ed[0], "0");
  prop.getValue(getCameraKey("e2", id).c_str(), ed[1], "0");
  prop.getValue(getCameraKey("e3", id).c_str(), ed[2], "0");
  prop.getValue(getCameraKey("e4", id).c_str(), ed[3], "0");
}